

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int send_max_streams(quicly_conn_t *conn,int uni,quicly_send_context_t *s)

{
  uint64_t *puVar1;
  uint uVar2;
  long lVar3;
  uint64_t uVar4;
  byte *pbVar5;
  bool bVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  byte *pbVar10;
  quicly_conn_t *_conn;
  long lVar11;
  ulong uVar12;
  quicly_sent_t *sent;
  quicly_sent_t *local_40;
  byte *local_38;
  
  iVar8 = should_send_max_streams(conn,uni);
  if (iVar8 == 0) {
    iVar8 = 0;
  }
  else {
    bVar6 = uni != 0;
    lVar3 = (&(conn->super).remote.bidi)[bVar6].next_stream_id;
    lVar11 = lVar3 + 3;
    if (-1 < lVar3) {
      lVar11 = lVar3;
    }
    uVar4 = (&(((conn->super).ctx)->transport_params).max_streams_bidi)[bVar6];
    uVar2 = (&(conn->super).remote.bidi)[bVar6].num_streams;
    iVar8 = allocate_ack_eliciting_frame(conn,s,9,&local_40,on_ack_max_streams);
    if (iVar8 == 0) {
      uVar7 = (ulong)(uni == 0);
      uVar12 = ((lVar11 >> 2) + uVar4) - (ulong)uVar2;
      pbVar5 = s->dst;
      *pbVar5 = uni == 0 ^ 0x13;
      pbVar10 = pbVar5 + 1;
      if (0x3f < uVar12) {
        if (uVar12 < 0x4000) {
          pbVar5[1] = (byte)(uVar12 >> 8) | 0x40;
          pbVar10 = pbVar5 + 2;
        }
        else {
          send_max_streams_cold_1();
          pbVar10 = local_38;
        }
      }
      *pbVar10 = (byte)uVar12;
      s->dst = pbVar10 + 1;
      (local_40->data).max_streams.uni = uni;
      if ((long)uVar12 < (long)(conn->egress).loss.largest_acked_packet_plus1[uVar7 * 4 + -0xe]) {
        __assert_fail("value >= m->max_committed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/maxsender.h"
                      ,0x69,
                      "void quicly_maxsender_record(quicly_maxsender_t *, int64_t, quicly_maxsender_sent_t *)"
                     );
      }
      (conn->egress).loss.largest_acked_packet_plus1[uVar7 * 4 + -0xe] = uVar12;
      puVar1 = (conn->egress).loss.largest_acked_packet_plus1 + uVar7 * 4 + -0xc;
      *puVar1 = *puVar1 + 1;
      puVar1 = (conn->egress).loss.largest_acked_packet_plus1 + uVar7 * 4 + -0xb;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfe;
      (local_40->data).packet.sent_at = uVar12 * 2 + 1;
      puVar1 = &(conn->super).stats.num_frames_sent.max_streams_bidi + (uni != 0);
      *puVar1 = *puVar1 + 1;
      iVar8 = 0;
      if (quicly_trace_fp != (FILE *)0x0) {
        iVar9 = ptls_skip_tracing((conn->crypto).tls);
        iVar8 = 0;
        if (iVar9 == 0) {
          iVar8 = 0;
          fprintf((FILE *)quicly_trace_fp,
                  "{\"type\":\"max-streams-send\", \"conn\":%u, \"time\":%lld, \"maximum\":%llu, \"is-unidirectional\":%lld}\n"
                  ,(ulong)(conn->super).local.cid_set.plaintext.master_id,(conn->stash).now,uVar12,
                  uni);
        }
      }
    }
  }
  return iVar8;
}

Assistant:

static int send_max_streams(quicly_conn_t *conn, int uni, quicly_send_context_t *s)
{
    if (!should_send_max_streams(conn, uni))
        return 0;

    quicly_maxsender_t *maxsender = uni ? &conn->ingress.max_streams.uni : &conn->ingress.max_streams.bidi;
    struct st_quicly_conn_streamgroup_state_t *group = uni ? &conn->super.remote.uni : &conn->super.remote.bidi;
    int ret;

    uint64_t new_count =
        group->next_stream_id / 4 +
        (uni ? conn->super.ctx->transport_params.max_streams_uni : conn->super.ctx->transport_params.max_streams_bidi) -
        group->num_streams;

    quicly_sent_t *sent;
    if ((ret = allocate_ack_eliciting_frame(conn, s, QUICLY_MAX_STREAMS_FRAME_CAPACITY, &sent, on_ack_max_streams)) != 0)
        return ret;
    s->dst = quicly_encode_max_streams_frame(s->dst, uni, new_count);
    sent->data.max_streams.uni = uni;
    quicly_maxsender_record(maxsender, new_count, &sent->data.max_streams.args);

    if (uni) {
        ++conn->super.stats.num_frames_sent.max_streams_uni;
    } else {
        ++conn->super.stats.num_frames_sent.max_streams_bidi;
    }
    QUICLY_PROBE(MAX_STREAMS_SEND, conn, conn->stash.now, new_count, uni);

    return 0;
}